

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  long lVar2;
  ImDrawIdx IVar3;
  long lVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  ImDrawIdx *pIVar8;
  int iVar9;
  ImDrawVert *pIVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ImDrawIdx IVar15;
  uint uVar16;
  ImDrawIdx IVar17;
  float fVar18;
  float fVar21;
  ImVec2 IVar19;
  ImVec2 IVar20;
  float fVar22;
  float fVar23;
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  
  if (2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      pIVar10 = this->_VtxWritePtr;
      uVar7 = 0;
      do {
        pIVar10->pos = points[uVar7];
        this->_VtxWritePtr->uv = IVar1;
        pIVar10 = this->_VtxWritePtr;
        pIVar10->col = col;
        pIVar10 = pIVar10 + 1;
        this->_VtxWritePtr = pIVar10;
        uVar7 = uVar7 + 1;
      } while ((uint)points_count != uVar7);
      uVar16 = this->_VtxCurrentIdx;
      pIVar8 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      iVar12 = uVar16 + 2;
      do {
        *pIVar8 = (ImDrawIdx)uVar16;
        pIVar8[1] = (ImDrawIdx)iVar12 - 1;
        pIVar8[2] = (ImDrawIdx)iVar12;
        pIVar8 = pIVar8 + 3;
        iVar12 = iVar12 + 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      this->_IdxWritePtr = pIVar8;
      this->_VtxCurrentIdx = uVar16 + (points_count & 0xffffU);
    }
    else {
      local_48 = ZEXT416((uint)this->_FringeScale);
      local_38 = col & 0xffffff;
      local_34 = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_34);
      auVar6 = local_48;
      uVar16 = this->_VtxCurrentIdx;
      local_48._4_4_ = 0;
      local_48._0_4_ = uVar16;
      uVar7 = local_48._0_8_;
      IVar3 = (ImDrawIdx)uVar16;
      pIVar8 = this->_IdxWritePtr;
      iVar12 = points_count + -2;
      iVar9 = uVar16 + 2;
      do {
        *pIVar8 = IVar3;
        pIVar8[1] = (ImDrawIdx)iVar9;
        iVar9 = iVar9 + 2;
        pIVar8[2] = (ImDrawIdx)iVar9;
        pIVar8 = pIVar8 + 3;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      this->_IdxWritePtr = pIVar8;
      uVar11 = (ulong)(uint)points_count;
      lVar2 = -(uVar11 * 8 + 0xf & 0xfffffffffffffff0);
      lVar4 = lVar2 + -0x48;
      iVar9 = points_count + -1;
      uVar14 = 0;
      local_48._0_4_ = auVar6._0_4_;
      uVar5 = local_48._0_4_;
      iVar12 = iVar9;
      local_48 = auVar6;
      do {
        lVar13 = (long)iVar12;
        fVar18 = points[uVar14].x - points[lVar13].x;
        fVar21 = points[uVar14].y - points[lVar13].y;
        fVar22 = fVar18 * fVar18 + fVar21 * fVar21;
        if (0.0 < fVar22) {
          fVar22 = 1.0 / SQRT(fVar22);
          fVar18 = fVar18 * fVar22;
          fVar21 = fVar21 * fVar22;
        }
        *(float *)(local_48 + lVar13 * 8 + lVar4 + 0x48) = fVar21;
        *(float *)(local_48 + lVar13 * 8 + lVar2 + 4) = -fVar18;
        iVar12 = (int)uVar14;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
      pIVar10 = this->_VtxWritePtr;
      uVar14 = 0;
      local_48 = CONCAT88(local_48._8_8_,uVar7);
      do {
        fVar21 = ((float)*(undefined8 *)(local_48 + uVar14 * 8 + lVar4 + 0x48) +
                 (float)*(undefined8 *)(local_48 + (long)iVar9 * 8 + lVar4 + 0x48)) * 0.5;
        fVar22 = ((float)((ulong)*(undefined8 *)(local_48 + uVar14 * 8 + lVar4 + 0x48) >> 0x20) +
                 (float)((ulong)*(undefined8 *)(local_48 + (long)iVar9 * 8 + lVar4 + 0x48) >> 0x20))
                 * 0.5;
        fVar23 = fVar21 * fVar21 + fVar22 * fVar22;
        fVar18 = 0.5;
        if (0.5 <= fVar23) {
          fVar18 = fVar23;
        }
        fVar21 = (1.0 / fVar18) * fVar21 * (float)uVar5 * 0.5;
        fVar18 = (1.0 / fVar18) * fVar22 * (float)uVar5 * 0.5;
        IVar19.x = points[uVar14].x - fVar21;
        IVar19.y = points[uVar14].y - fVar18;
        pIVar10->pos = IVar19;
        pIVar10->uv = IVar1;
        pIVar10 = this->_VtxWritePtr;
        pIVar10->col = col;
        IVar20.x = points[uVar14].x + fVar21;
        IVar20.y = points[uVar14].y + fVar18;
        pIVar10[1].pos = IVar20;
        pIVar10[1].uv = IVar1;
        pIVar10 = this->_VtxWritePtr;
        pIVar10[1].col = local_38;
        pIVar10 = pIVar10 + 2;
        this->_VtxWritePtr = pIVar10;
        pIVar8 = this->_IdxWritePtr;
        IVar15 = (ImDrawIdx)uVar16;
        *pIVar8 = IVar15;
        pIVar8[1] = IVar3 + (short)iVar9 * 2;
        IVar17 = IVar3 + 1 + (short)iVar9 * 2;
        pIVar8[2] = IVar17;
        pIVar8[3] = IVar17;
        pIVar8[4] = IVar15 + 1;
        pIVar8[5] = IVar15;
        this->_IdxWritePtr = pIVar8 + 6;
        iVar9 = (int)uVar14;
        uVar14 = uVar14 + 1;
        uVar16 = uVar16 + 2;
      } while (uVar11 != uVar14);
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (local_34 & 0xfffe);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}